

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcRtFileFont.cpp
# Opt level: O2

GrcRtFileFont * __thiscall GrcRtFileFont::copyThis(GrcRtFileFont *this)

{
  GrcRtFileFont *this_00;
  
  this_00 = (GrcRtFileFont *)operator_new(0x68);
  GrcRtFileFont(this_00,this);
  return this_00;
}

Assistant:

GrcRtFileFont * GrcRtFileFont::copyThis()
{
	GrcRtFileFont * copy = new GrcRtFileFont(*this);
	return copy;
}